

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.h
# Opt level: O3

int __thiscall asl::SocketServer::bind(SocketServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  String local_30;
  
  String::String(&local_30,"0.0.0.0");
  iVar1 = bind(this,(int)&local_30,(sockaddr *)(ulong)(uint)__fd,__len);
  if (local_30._size != 0) {
    free(local_30.field_2._str);
  }
  return iVar1;
}

Assistant:

bool bind(int port) { return bind("0.0.0.0", port); }